

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error storeAtts(XML_Parser parser,ENCODING *enc,char *attStr,TAG_NAME *tagNamePtr,
                   BINDING **bindingsPtr)

{
  byte bVar1;
  STRING_POOL *pool;
  XML_Char XVar2;
  char cVar3;
  DTD *pDVar4;
  ATTRIBUTE *pAVar5;
  DEFAULT_ATTRIBUTE *pDVar6;
  XML_Parser pXVar7;
  undefined8 *puVar8;
  XML_Char *pXVar9;
  byte bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  byte bVar13;
  XML_Bool XVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  XML_Error XVar18;
  uint uVar19;
  ATTRIBUTE *pAVar20;
  ATTRIBUTE_ID *pAVar21;
  XML_Char *pXVar22;
  long lVar23;
  NS_ATT *pNVar24;
  NAMED *pNVar25;
  size_t sVar26;
  uint64_t uVar27;
  char *pcVar28;
  BINDING *pBVar29;
  TAG *pTVar30;
  int iVar31;
  XML_Parser pXVar32;
  NS_ATT *pNVar33;
  long lVar34;
  size_t sVar35;
  unsigned_long uVar36;
  char *pcVar37;
  byte bVar38;
  ulong uVar39;
  ulong uVar40;
  int iVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  siphash sip_state;
  ELEMENT_TYPE *local_b0;
  siphash local_68;
  
  pDVar4 = parser->m_dtd;
  local_b0 = (ELEMENT_TYPE *)lookup(parser,&pDVar4->elementTypes,tagNamePtr->str,0);
  if (local_b0 == (ELEMENT_TYPE *)0x0) {
    pXVar22 = poolCopyString(&pDVar4->pool,tagNamePtr->str);
    if (pXVar22 == (XML_Char *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    local_b0 = (ELEMENT_TYPE *)lookup(parser,&pDVar4->elementTypes,pXVar22,0x28);
    if (local_b0 == (ELEMENT_TYPE *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    if ((parser->m_ns != '\0') && (iVar41 = setElementTypePrefix(parser,local_b0), iVar41 == 0)) {
      return XML_ERROR_NO_MEMORY;
    }
  }
  uVar19 = local_b0->nDefaultAtts;
  uVar15 = (*enc->getAtts)(enc,attStr,parser->m_attsSize,parser->m_atts);
  iVar16 = uVar15 + uVar19;
  iVar41 = parser->m_attsSize;
  pAVar20 = parser->m_atts;
  if (iVar41 < iVar16) {
    parser->m_attsSize = iVar16 + 0x10;
    pAVar20 = (ATTRIBUTE *)(*(parser->m_mem).realloc_fcn)(pAVar20,(long)iVar16 * 0x20 + 0x200);
    if (pAVar20 != (ATTRIBUTE *)0x0) {
      parser->m_atts = pAVar20;
      if (iVar41 < (int)uVar15) {
        (*enc->getAtts)(enc,attStr,uVar15,pAVar20);
        pAVar20 = parser->m_atts;
      }
      goto LAB_003dcbf3;
    }
    parser->m_attsSize = iVar41;
LAB_003dcbe3:
    XVar18 = XML_ERROR_NO_MEMORY;
  }
  else {
LAB_003dcbf3:
    if ((int)uVar15 < 1) {
      iVar16 = 0;
      iVar41 = 0;
    }
    else {
      uVar39 = 0;
      iVar41 = 0;
      iVar16 = 0;
      do {
        pcVar37 = parser->m_atts[uVar39].name;
        iVar17 = (*enc->nameLength)(enc,pcVar37);
        pAVar21 = getAttributeId(parser,enc,pcVar37,pcVar37 + iVar17);
        if (pAVar21 == (ATTRIBUTE_ID *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        if (pAVar21->name[-1] != '\0') {
          if (parser->m_encoding == enc) {
            parser->m_eventPtr = parser->m_atts[uVar39].name;
            return XML_ERROR_DUPLICATE_ATTRIBUTE;
          }
          return XML_ERROR_DUPLICATE_ATTRIBUTE;
        }
        pAVar21->name[-1] = '\x01';
        iVar17 = iVar41 + 1;
        (&pAVar20->name)[iVar41] = pAVar21->name;
        pAVar5 = parser->m_atts;
        if (pAVar5[uVar39].normalized == '\0') {
          XVar14 = '\x01';
          if ((pAVar21->maybeTokenized != '\0') && (0 < (int)uVar19)) {
            lVar23 = 0;
            do {
              if (pAVar21 == *(ATTRIBUTE_ID **)((long)&local_b0->defaultAtts->id + lVar23)) {
                XVar14 = (&local_b0->defaultAtts->isCdata)[lVar23];
                break;
              }
              lVar23 = lVar23 + 0x18;
            } while ((ulong)uVar19 * 0x18 != lVar23);
          }
          XVar18 = storeAttributeValue(parser,enc,XVar14,pAVar5[uVar39].valuePtr,
                                       pAVar5[uVar39].valueEnd,&parser->m_tempPool);
          if (XVar18 != XML_ERROR_NONE) {
            return XVar18;
          }
          (&pAVar20->name)[iVar17] = (parser->m_tempPool).start;
        }
        else {
          pXVar22 = poolStoreString(&parser->m_tempPool,enc,pAVar5[uVar39].valuePtr,
                                    pAVar5[uVar39].valueEnd);
          (&pAVar20->name)[iVar17] = pXVar22;
          if (pXVar22 == (XML_Char *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
        }
        (parser->m_tempPool).start = (parser->m_tempPool).ptr;
        if (pAVar21->prefix == (PREFIX *)0x0) {
          iVar41 = iVar41 + 2;
        }
        else if (pAVar21->xmlns == '\0') {
          iVar41 = iVar41 + 2;
          iVar16 = iVar16 + 1;
          pAVar21->name[-1] = '\x02';
        }
        else {
          XVar18 = addBinding(parser,pAVar21->prefix,pAVar21,(&pAVar20->name)[iVar17],bindingsPtr);
          if (XVar18 != XML_ERROR_NONE) {
            return XVar18;
          }
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 != uVar15);
    }
    parser->m_nSpecifiedAtts = iVar41;
    lVar23 = 0xffffffff;
    if ((local_b0->idAtt == (ATTRIBUTE_ID *)0x0) ||
       (pcVar37 = local_b0->idAtt->name, pcVar37[-1] == '\0')) {
LAB_003dce30:
      parser->m_idAttIndex = (int)lVar23;
    }
    else if (0 < iVar41) {
      lVar23 = 0;
      do {
        if ((&pAVar20->name)[lVar23] == pcVar37) goto LAB_003dce30;
        lVar23 = lVar23 + 2;
      } while ((int)lVar23 < iVar41);
    }
    if (0 < (int)uVar19) {
      lVar23 = 0;
      do {
        pDVar6 = local_b0->defaultAtts;
        pAVar21 = *(ATTRIBUTE_ID **)((long)&pDVar6->id + lVar23);
        pXVar22 = pAVar21->name;
        if ((pXVar22[-1] == '\0') &&
           (pXVar9 = *(XML_Char **)((long)&pDVar6->value + lVar23), pXVar9 != (XML_Char *)0x0)) {
          if (pAVar21->prefix == (PREFIX *)0x0) {
            pXVar22[-1] = '\x01';
          }
          else {
            if (pAVar21->xmlns != '\0') {
              XVar18 = addBinding(parser,pAVar21->prefix,pAVar21,pXVar9,bindingsPtr);
              if (XVar18 != XML_ERROR_NONE) {
                return XVar18;
              }
              goto LAB_003dce60;
            }
            pXVar22[-1] = '\x02';
            iVar16 = iVar16 + 1;
          }
          (&pAVar20->name)[iVar41] = (char *)**(undefined8 **)((long)&pDVar6->id + lVar23);
          (&pAVar20->valuePtr)[iVar41] = *(char **)((long)&pDVar6->value + lVar23);
          iVar41 = iVar41 + 2;
        }
LAB_003dce60:
        lVar23 = lVar23 + 0x18;
      } while ((ulong)uVar19 * 0x18 != lVar23);
    }
    (&pAVar20->name)[iVar41] = (char *)0x0;
    uVar39 = 0;
    if (iVar16 != 0) {
      bVar38 = parser->m_nsAttsPower;
      bVar13 = bVar38;
      if (iVar16 * 2 >> (bVar38 & 0x1f) == 0) {
        iVar17 = 1 << (bVar38 & 0x1f);
        uVar36 = parser->m_nsAttsVersion;
        if (uVar36 == 0) goto LAB_003dcfbd;
      }
      else {
        do {
          bVar1 = bVar13 + 1;
          bVar10 = bVar13 & 0x1f;
          bVar13 = bVar1;
        } while (iVar16 >> bVar10 != 0);
        bVar13 = 3;
        if (3 < bVar1) {
          bVar13 = bVar1;
        }
        parser->m_nsAttsPower = bVar13;
        iVar17 = 1 << (bVar13 & 0x1f);
        pNVar24 = (NS_ATT *)(*(parser->m_mem).realloc_fcn)(parser->m_nsAtts,(long)iVar17 * 0x18);
        if (pNVar24 == (NS_ATT *)0x0) {
          parser->m_nsAttsPower = bVar38;
          return XML_ERROR_NO_MEMORY;
        }
        parser->m_nsAtts = pNVar24;
LAB_003dcfbd:
        auVar12 = _DAT_004eac40;
        auVar11 = _DAT_004eac30;
        uVar36 = 0xffffffff;
        lVar34 = (long)iVar17;
        lVar23 = lVar34 + -1;
        auVar43._8_4_ = (int)lVar23;
        auVar43._0_8_ = lVar23;
        auVar43._12_4_ = (int)((ulong)lVar23 >> 0x20);
        pNVar24 = parser->m_nsAtts + lVar34 + -1;
        uVar39 = 0;
        auVar43 = auVar43 ^ _DAT_004eac40;
        do {
          auVar44._8_4_ = (int)uVar39;
          auVar44._0_8_ = uVar39;
          auVar44._12_4_ = (int)(uVar39 >> 0x20);
          auVar44 = (auVar44 | auVar11) ^ auVar12;
          if ((bool)(~(auVar44._4_4_ == auVar43._4_4_ && auVar43._0_4_ < auVar44._0_4_ ||
                      auVar43._4_4_ < auVar44._4_4_) & 1)) {
            pNVar24->version = 0xffffffff;
          }
          if ((auVar44._12_4_ != auVar43._12_4_ || auVar44._8_4_ <= auVar43._8_4_) &&
              auVar44._12_4_ <= auVar43._12_4_) {
            pNVar24[-1].version = 0xffffffff;
          }
          uVar39 = uVar39 + 2;
          pNVar24 = pNVar24 + -2;
        } while ((lVar34 + 1U & 0xfffffffffffffffe) != uVar39);
      }
      uVar39 = 0;
      uVar36 = uVar36 - 1;
      parser->m_nsAttsVersion = uVar36;
      if (0 < iVar41) {
        pool = &parser->m_tempPool;
        uVar19 = iVar17 - 1;
        uVar39 = 0;
        do {
          pcVar37 = (&pAVar20->name)[uVar39];
          pXVar7 = parser;
          if (pcVar37[-1] == '\x02') {
            do {
              pXVar32 = pXVar7;
              pXVar7 = pXVar32->m_parentParser;
            } while (pXVar7 != (XML_Parser)0x0);
            local_68.v3 = pXVar32->m_hash_secret_salt;
            local_68.v0 = 0x736f6d6570736575;
            local_68.v1 = local_68.v3 ^ 0x646f72616e646f6d;
            local_68.v2 = 0x6c7967656e657261;
            local_68.v3 = local_68.v3 ^ 0x7465646279746573;
            local_68.c = 0;
            pcVar37[-1] = '\0';
            local_68.p = local_68.buf;
            pNVar25 = lookup(parser,&pDVar4->attributeIds,pcVar37,0);
            if (pNVar25 == (NAMED *)0x0) {
              return XML_ERROR_NO_MEMORY;
            }
            if (pNVar25[1].name == (KEY)0x0) {
              return XML_ERROR_NO_MEMORY;
            }
            puVar8 = *(undefined8 **)(pNVar25[1].name + 8);
            if (puVar8 == (undefined8 *)0x0) {
              return XML_ERROR_UNBOUND_PREFIX;
            }
            sVar35 = (size_t)*(int *)(puVar8 + 5);
            if (0 < (long)sVar35) {
              lVar23 = 0;
              do {
                XVar2 = *(XML_Char *)(puVar8[4] + lVar23);
                pXVar22 = (parser->m_tempPool).ptr;
                if (pXVar22 == (parser->m_tempPool).end) {
                  XVar14 = poolGrow(pool);
                  if (XVar14 == '\0') {
                    return XML_ERROR_NO_MEMORY;
                  }
                  pXVar22 = (parser->m_tempPool).ptr;
                }
                (parser->m_tempPool).ptr = pXVar22 + 1;
                *pXVar22 = XVar2;
                lVar23 = lVar23 + 1;
                sVar35 = (size_t)*(int *)(puVar8 + 5);
              } while (lVar23 < (long)sVar35);
            }
            sip24_update(&local_68,(void *)puVar8[4],sVar35);
            do {
              pcVar28 = pcVar37;
              pcVar37 = pcVar28 + 1;
            } while (*pcVar28 != ':');
            if (*pcVar37 == '\0') {
              sVar35 = 0;
            }
            else {
              sVar26 = 0;
              do {
                sVar35 = sVar26 + 1;
                lVar23 = sVar26 + 2;
                sVar26 = sVar35;
              } while (pcVar28[lVar23] != '\0');
            }
            sip24_update(&local_68,pcVar37,sVar35);
            do {
              pcVar28 = (parser->m_tempPool).ptr;
              if (pcVar28 == (parser->m_tempPool).end) {
                XVar14 = poolGrow(pool);
                if (XVar14 == '\0') {
                  return XML_ERROR_NO_MEMORY;
                }
                pcVar28 = (parser->m_tempPool).ptr;
              }
              cVar3 = *pcVar37;
              (parser->m_tempPool).ptr = pcVar28 + 1;
              *pcVar28 = cVar3;
              cVar3 = *pcVar37;
              pcVar37 = pcVar37 + 1;
            } while (cVar3 != '\0');
            uVar27 = sip24_final(&local_68);
            uVar15 = uVar19 & (uint)uVar27;
            pNVar24 = parser->m_nsAtts;
            lVar23 = (long)(int)uVar15;
            if (pNVar24[lVar23].version == uVar36) {
              pNVar33 = pNVar24 + lVar23;
              bVar38 = 0;
              do {
                if (uVar27 == pNVar33->hash) {
                  pcVar37 = (parser->m_tempPool).start;
                  cVar3 = *pcVar37;
                  bVar42 = cVar3 == '\0';
                  if ((!bVar42) && (cVar3 == *pNVar33->uriName)) {
                    lVar23 = 1;
                    do {
                      cVar3 = pcVar37[lVar23];
                      bVar42 = cVar3 == '\0';
                      if (bVar42) break;
                      pcVar28 = pNVar33->uriName + lVar23;
                      lVar23 = lVar23 + 1;
                    } while (cVar3 == *pcVar28);
                  }
                  if (bVar42) {
                    return XML_ERROR_DUPLICATE_ATTRIBUTE;
                  }
                }
                if (bVar38 == 0) {
                  bVar38 = (byte)((uVar27 & ~(long)(int)uVar19) >>
                                 ((char)*(undefined4 *)&parser->m_nsAttsPower - 1U & 0x3f)) &
                           (byte)((ulong)(long)(int)uVar19 >> 2) | 1;
                }
                iVar31 = 0;
                if ((int)uVar15 < (int)(uint)bVar38) {
                  iVar31 = iVar17;
                }
                uVar15 = (uVar15 - bVar38) + iVar31;
                lVar23 = (long)(int)uVar15;
                pNVar33 = pNVar24 + lVar23;
              } while (pNVar33->version == uVar36);
            }
            if (parser->m_ns_triplets != '\0') {
              (parser->m_tempPool).ptr[-1] = parser->m_namespaceSeparator;
              pcVar37 = *(char **)*puVar8;
              do {
                pcVar28 = (parser->m_tempPool).ptr;
                if (pcVar28 == (parser->m_tempPool).end) {
                  XVar14 = poolGrow(pool);
                  if (XVar14 == '\0') {
                    return XML_ERROR_NO_MEMORY;
                  }
                  pcVar28 = (parser->m_tempPool).ptr;
                }
                cVar3 = *pcVar37;
                (parser->m_tempPool).ptr = pcVar28 + 1;
                *pcVar28 = cVar3;
                cVar3 = *pcVar37;
                pcVar37 = pcVar37 + 1;
              } while (cVar3 != '\0');
            }
            pcVar37 = (parser->m_tempPool).start;
            (parser->m_tempPool).start = (parser->m_tempPool).ptr;
            (&pAVar20->name)[uVar39] = pcVar37;
            pNVar24 = parser->m_nsAtts;
            pNVar24[lVar23].version = uVar36;
            pNVar24[lVar23].hash = uVar27;
            pNVar24[lVar23].uriName = pcVar37;
            iVar16 = iVar16 + -1;
            if (iVar16 == 0) {
              uVar39 = (ulong)((int)uVar39 + 2);
              break;
            }
          }
          else {
            pcVar37[-1] = '\0';
          }
          uVar39 = uVar39 + 2;
        } while ((int)uVar39 < iVar41);
      }
    }
    if ((int)uVar39 < iVar41) {
      lVar23 = (long)(int)uVar39;
      do {
        (&pAVar20->name)[lVar23][-1] = '\0';
        lVar23 = lVar23 + 2;
      } while (lVar23 < iVar41);
    }
    for (pBVar29 = *bindingsPtr; pBVar29 != (BINDING *)0x0; pBVar29 = pBVar29->nextTagBinding) {
      pBVar29->attId->name[-1] = '\0';
    }
    if (parser->m_ns == '\0') {
      return XML_ERROR_NONE;
    }
    if (local_b0->prefix == (PREFIX *)0x0) {
      pBVar29 = (pDVar4->defaultPrefix).binding;
      if (pBVar29 == (BINDING *)0x0) {
        return XML_ERROR_NONE;
      }
      pcVar37 = tagNamePtr->str;
    }
    else {
      pBVar29 = local_b0->prefix->binding;
      if (pBVar29 == (BINDING *)0x0) {
        return XML_ERROR_UNBOUND_PREFIX;
      }
      pcVar37 = tagNamePtr->str;
      do {
        cVar3 = *pcVar37;
        pcVar37 = pcVar37 + 1;
      } while (cVar3 != ':');
    }
    lVar23 = 0;
    pXVar22 = pBVar29->prefix->name;
    if ((parser->m_ns_triplets != '\0') && (pXVar22 != (XML_Char *)0x0)) {
      lVar23 = 0;
      do {
        pcVar28 = pXVar22 + lVar23;
        lVar23 = lVar23 + 1;
      } while (*pcVar28 != '\0');
    }
    tagNamePtr->localPart = pcVar37;
    iVar41 = pBVar29->uriLen;
    tagNamePtr->uriLen = iVar41;
    tagNamePtr->prefix = pXVar22;
    iVar16 = (int)lVar23;
    tagNamePtr->prefixLen = iVar16;
    uVar39 = 0;
    do {
      uVar40 = uVar39;
      uVar39 = uVar40 + 1;
    } while (pcVar37[uVar40] != '\0');
    if (pBVar29->uriAlloc < iVar41 + iVar16 + (int)uVar39) {
      iVar41 = iVar41 + iVar16 + (int)uVar39 + 0x18;
      pXVar22 = (XML_Char *)(*(parser->m_mem).malloc_fcn)((long)iVar41);
      if (pXVar22 == (XML_Char *)0x0) goto LAB_003dcbe3;
      pBVar29->uriAlloc = iVar41;
      memcpy(pXVar22,pBVar29->uri,(long)pBVar29->uriLen);
      pXVar9 = pBVar29->uri;
      for (pTVar30 = parser->m_tagStack; pTVar30 != (TAG *)0x0; pTVar30 = pTVar30->parent) {
        if ((pTVar30->name).str == pXVar9) {
          (pTVar30->name).str = pXVar22;
        }
      }
      (*(parser->m_mem).free_fcn)(pXVar9);
      pBVar29->uri = pXVar22;
      iVar41 = pBVar29->uriLen;
    }
    else {
      pXVar22 = pBVar29->uri;
    }
    pXVar22 = pXVar22 + iVar41;
    memcpy(pXVar22,pcVar37,uVar39 & 0xffffffff);
    if (iVar16 != 0) {
      pXVar22[uVar40] = parser->m_namespaceSeparator;
      memcpy(pXVar22 + uVar39,pBVar29->prefix->name,(long)iVar16);
    }
    tagNamePtr->str = pBVar29->uri;
    XVar18 = XML_ERROR_NONE;
  }
  return XVar18;
}

Assistant:

static enum XML_Error
storeAtts(XML_Parser parser, const ENCODING *enc,
          const char *attStr, TAG_NAME *tagNamePtr,
          BINDING **bindingsPtr)
{
  DTD * const dtd = _dtd;  /* save one level of indirection */
  ELEMENT_TYPE *elementType;
  int nDefaultAtts;
  const XML_Char **appAtts;   /* the attribute list for the application */
  int attIndex = 0;
  int prefixLen;
  int i;
  int n;
  XML_Char *uri;
  int nPrefixes = 0;
  BINDING *binding;
  const XML_Char *localPart;

  /* lookup the element type name */
  elementType = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, tagNamePtr->str,0);
  if (!elementType) {
    const XML_Char *name = poolCopyString(&dtd->pool, tagNamePtr->str);
    if (!name)
      return XML_ERROR_NO_MEMORY;
    elementType = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, name,
                                         sizeof(ELEMENT_TYPE));
    if (!elementType)
      return XML_ERROR_NO_MEMORY;
    if (ns && !setElementTypePrefix(parser, elementType))
      return XML_ERROR_NO_MEMORY;
  }
  nDefaultAtts = elementType->nDefaultAtts;

  /* get the attributes from the tokenizer */
  n = XmlGetAttributes(enc, attStr, attsSize, atts);
  if (n + nDefaultAtts > attsSize) {
    int oldAttsSize = attsSize;
    ATTRIBUTE *temp;
#ifdef XML_ATTR_INFO
    XML_AttrInfo *temp2;
#endif
    attsSize = n + nDefaultAtts + INIT_ATTS_SIZE;
    temp = (ATTRIBUTE *)REALLOC((void *)atts, attsSize * sizeof(ATTRIBUTE));
    if (temp == NULL) {
      attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    atts = temp;
#ifdef XML_ATTR_INFO
    temp2 = (XML_AttrInfo *)REALLOC((void *)attInfo, attsSize * sizeof(XML_AttrInfo));
    if (temp2 == NULL) {
      attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    attInfo = temp2;
#endif
    if (n > oldAttsSize)
      XmlGetAttributes(enc, attStr, n, atts);
  }

  appAtts = (const XML_Char **)atts;
  for (i = 0; i < n; i++) {
    ATTRIBUTE *currAtt = &atts[i];
#ifdef XML_ATTR_INFO
    XML_AttrInfo *currAttInfo = &attInfo[i];
#endif
    /* add the name and value to the attribute list */
    ATTRIBUTE_ID *attId = getAttributeId(parser, enc, currAtt->name,
                                         currAtt->name
                                         + XmlNameLength(enc, currAtt->name));
    if (!attId)
      return XML_ERROR_NO_MEMORY;
#ifdef XML_ATTR_INFO
    currAttInfo->nameStart = parseEndByteIndex - (parseEndPtr - currAtt->name);
    currAttInfo->nameEnd = currAttInfo->nameStart +
                           XmlNameLength(enc, currAtt->name);
    currAttInfo->valueStart = parseEndByteIndex -
                            (parseEndPtr - currAtt->valuePtr);
    currAttInfo->valueEnd = parseEndByteIndex - (parseEndPtr - currAtt->valueEnd);
#endif
    /* Detect duplicate attributes by their QNames. This does not work when
       namespace processing is turned on and different prefixes for the same
       namespace are used. For this case we have a check further down.
    */
    if ((attId->name)[-1]) {
      if (enc == encoding)
        eventPtr = atts[i].name;
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    (attId->name)[-1] = 1;
    appAtts[attIndex++] = attId->name;
    if (!atts[i].normalized) {
      enum XML_Error result;
      XML_Bool isCdata = XML_TRUE;

      /* figure out whether declared as other than CDATA */
      if (attId->maybeTokenized) {
        int j;
        for (j = 0; j < nDefaultAtts; j++) {
          if (attId == elementType->defaultAtts[j].id) {
            isCdata = elementType->defaultAtts[j].isCdata;
            break;
          }
        }
      }

      /* normalize the attribute value */
      result = storeAttributeValue(parser, enc, isCdata,
                                   atts[i].valuePtr, atts[i].valueEnd,
                                   &tempPool);
      if (result)
        return result;
      appAtts[attIndex] = poolStart(&tempPool);
      poolFinish(&tempPool);
    }
    else {
      /* the value did not need normalizing */
      appAtts[attIndex] = poolStoreString(&tempPool, enc, atts[i].valuePtr,
                                          atts[i].valueEnd);
      if (appAtts[attIndex] == 0)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&tempPool);
    }
    /* handle prefixed attribute names */
    if (attId->prefix) {
      if (attId->xmlns) {
        /* deal with namespace declarations here */
        enum XML_Error result = addBinding(parser, attId->prefix, attId,
                                           appAtts[attIndex], bindingsPtr);
        if (result)
          return result;
        --attIndex;
      }
      else {
        /* deal with other prefixed names later */
        attIndex++;
        nPrefixes++;
        (attId->name)[-1] = 2;
      }
    }
    else
      attIndex++;
  }

  /* set-up for XML_GetSpecifiedAttributeCount and XML_GetIdAttributeIndex */
  nSpecifiedAtts = attIndex;
  if (elementType->idAtt && (elementType->idAtt->name)[-1]) {
    for (i = 0; i < attIndex; i += 2)
      if (appAtts[i] == elementType->idAtt->name) {
        idAttIndex = i;
        break;
      }
  }
  else
    idAttIndex = -1;

  /* do attribute defaulting */
  for (i = 0; i < nDefaultAtts; i++) {
    const DEFAULT_ATTRIBUTE *da = elementType->defaultAtts + i;
    if (!(da->id->name)[-1] && da->value) {
      if (da->id->prefix) {
        if (da->id->xmlns) {
          enum XML_Error result = addBinding(parser, da->id->prefix, da->id,
                                             da->value, bindingsPtr);
          if (result)
            return result;
        }
        else {
          (da->id->name)[-1] = 2;
          nPrefixes++;
          appAtts[attIndex++] = da->id->name;
          appAtts[attIndex++] = da->value;
        }
      }
      else {
        (da->id->name)[-1] = 1;
        appAtts[attIndex++] = da->id->name;
        appAtts[attIndex++] = da->value;
      }
    }
  }
  appAtts[attIndex] = 0;

  /* expand prefixed attribute names, check for duplicates,
     and clear flags that say whether attributes were specified */
  i = 0;
  if (nPrefixes) {
    int j;  /* hash table index */
    unsigned long version = nsAttsVersion;
    int nsAttsSize = (int)1 << nsAttsPower;
    unsigned char oldNsAttsPower = nsAttsPower;
    /* size of hash table must be at least 2 * (# of prefixed attributes) */
    if ((nPrefixes << 1) >> nsAttsPower) {  /* true for nsAttsPower = 0 */
      NS_ATT *temp;
      /* hash table size must also be a power of 2 and >= 8 */
      while (nPrefixes >> nsAttsPower++);
      if (nsAttsPower < 3)
        nsAttsPower = 3;
      nsAttsSize = (int)1 << nsAttsPower;
      temp = (NS_ATT *)REALLOC(nsAtts, nsAttsSize * sizeof(NS_ATT));
      if (!temp) {
        /* Restore actual size of memory in nsAtts */
        nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }
      nsAtts = temp;
      version = 0;  /* force re-initialization of nsAtts hash table */
    }
    /* using a version flag saves us from initializing nsAtts every time */
    if (!version) {  /* initialize version flags when version wraps around */
      version = INIT_ATTS_VERSION;
      for (j = nsAttsSize; j != 0; )
        nsAtts[--j].version = version;
    }
    nsAttsVersion = --version;

    /* expand prefixed names and check for duplicates */
    for (; i < attIndex; i += 2) {
      const XML_Char *s = appAtts[i];
      if (s[-1] == 2) {  /* prefixed */
        ATTRIBUTE_ID *id;
        const BINDING *b;
        unsigned long uriHash;
        struct siphash sip_state;
        struct sipkey sip_key;

        copy_salt_to_sipkey(parser, &sip_key);
        sip24_init(&sip_state, &sip_key);

        ((XML_Char *)s)[-1] = 0;  /* clear flag */
        id = (ATTRIBUTE_ID *)lookup(parser, &dtd->attributeIds, s, 0);
        if (!id || !id->prefix) {
          /* This code is walking through the appAtts array, dealing
           * with (in this case) a prefixed attribute name.  To be in
           * the array, the attribute must have already been bound, so
           * has to have passed through the hash table lookup once
           * already.  That implies that an entry for it already
           * exists, so the lookup above will return a pointer to
           * already allocated memory.  There is no opportunaity for
           * the allocator to fail, so the condition above cannot be
           * fulfilled.
           *
           * Since it is difficult to be certain that the above
           * analysis is complete, we retain the test and merely
           * remove the code from coverage tests.
           */
          return XML_ERROR_NO_MEMORY; /* LCOV_EXCL_LINE */
        }
        b = id->prefix->binding;
        if (!b)
          return XML_ERROR_UNBOUND_PREFIX;

        for (j = 0; j < b->uriLen; j++) {
          const XML_Char c = b->uri[j];
          if (!poolAppendChar(&tempPool, c))
            return XML_ERROR_NO_MEMORY;
        }

        sip24_update(&sip_state, b->uri, b->uriLen * sizeof(XML_Char));

        while (*s++ != XML_T(ASCII_COLON))
          ;

        sip24_update(&sip_state, s, keylen(s) * sizeof(XML_Char));

        do {  /* copies null terminator */
          if (!poolAppendChar(&tempPool, *s))
            return XML_ERROR_NO_MEMORY;
        } while (*s++);

        uriHash = (unsigned long)sip24_final(&sip_state);

        { /* Check hash table for duplicate of expanded name (uriName).
             Derived from code in lookup(parser, HASH_TABLE *table, ...).
          */
          unsigned char step = 0;
          unsigned long mask = nsAttsSize - 1;
          j = uriHash & mask;  /* index into hash table */
          while (nsAtts[j].version == version) {
            /* for speed we compare stored hash values first */
            if (uriHash == nsAtts[j].hash) {
              const XML_Char *s1 = poolStart(&tempPool);
              const XML_Char *s2 = nsAtts[j].uriName;
              /* s1 is null terminated, but not s2 */
              for (; *s1 == *s2 && *s1 != 0; s1++, s2++);
              if (*s1 == 0)
                return XML_ERROR_DUPLICATE_ATTRIBUTE;
            }
            if (!step)
              step = PROBE_STEP(uriHash, mask, nsAttsPower);
            j < step ? (j += nsAttsSize - step) : (j -= step);
          }
        }

        if (ns_triplets) {  /* append namespace separator and prefix */
          tempPool.ptr[-1] = namespaceSeparator;
          s = b->prefix->name;
          do {
            if (!poolAppendChar(&tempPool, *s))
              return XML_ERROR_NO_MEMORY;
          } while (*s++);
        }

        /* store expanded name in attribute list */
        s = poolStart(&tempPool);
        poolFinish(&tempPool);
        appAtts[i] = s;

        /* fill empty slot with new version, uriName and hash value */
        nsAtts[j].version = version;
        nsAtts[j].hash = uriHash;
        nsAtts[j].uriName = s;

        if (!--nPrefixes) {
          i += 2;
          break;
        }
      }
      else  /* not prefixed */
        ((XML_Char *)s)[-1] = 0;  /* clear flag */
    }
  }
  /* clear flags for the remaining attributes */
  for (; i < attIndex; i += 2)
    ((XML_Char *)(appAtts[i]))[-1] = 0;
  for (binding = *bindingsPtr; binding; binding = binding->nextTagBinding)
    binding->attId->name[-1] = 0;

  if (!ns)
    return XML_ERROR_NONE;

  /* expand the element type name */
  if (elementType->prefix) {
    binding = elementType->prefix->binding;
    if (!binding)
      return XML_ERROR_UNBOUND_PREFIX;
    localPart = tagNamePtr->str;
    while (*localPart++ != XML_T(ASCII_COLON))
      ;
  }
  else if (dtd->defaultPrefix.binding) {
    binding = dtd->defaultPrefix.binding;
    localPart = tagNamePtr->str;
  }
  else
    return XML_ERROR_NONE;
  prefixLen = 0;
  if (ns_triplets && binding->prefix->name) {
    for (; binding->prefix->name[prefixLen++];)
      ;  /* prefixLen includes null terminator */
  }
  tagNamePtr->localPart = localPart;
  tagNamePtr->uriLen = binding->uriLen;
  tagNamePtr->prefix = binding->prefix->name;
  tagNamePtr->prefixLen = prefixLen;
  for (i = 0; localPart[i++];)
    ;  /* i includes null terminator */
  n = i + binding->uriLen + prefixLen;
  if (n > binding->uriAlloc) {
    TAG *p;
    uri = (XML_Char *)MALLOC((n + EXPAND_SPARE) * sizeof(XML_Char));
    if (!uri)
      return XML_ERROR_NO_MEMORY;
    binding->uriAlloc = n + EXPAND_SPARE;
    memcpy(uri, binding->uri, binding->uriLen * sizeof(XML_Char));
    for (p = tagStack; p; p = p->parent)
      if (p->name.str == binding->uri)
        p->name.str = uri;
    FREE(binding->uri);
    binding->uri = uri;
  }
  /* if namespaceSeparator != '\0' then uri includes it already */
  uri = binding->uri + binding->uriLen;
  memcpy(uri, localPart, i * sizeof(XML_Char));
  /* we always have a namespace separator between localPart and prefix */
  if (prefixLen) {
    uri += i - 1;
    *uri = namespaceSeparator;  /* replace null terminator */
    memcpy(uri + 1, binding->prefix->name, prefixLen * sizeof(XML_Char));
  }
  tagNamePtr->str = binding->uri;
  return XML_ERROR_NONE;
}